

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_file_sink-inl.h
# Opt level: O0

string * spdlog::sinks::rotating_file_sink<spdlog::details::null_mutex>::calc_filename
                   (filename_t *filename,size_t index)

{
  char *pcVar1;
  size_t sVar2;
  long in_RDX;
  string *in_RSI;
  string *in_RDI;
  basic_string_view<char> bVar3;
  format_args in_stack_00000000;
  string_view in_stack_00000010;
  filename_t ext;
  filename_t basename;
  int unused;
  string_view sv;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  basic_string_view<char> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  anon_class_1_0_00000001 *this;
  undefined1 local_231;
  format_string_checker<char,_3,_0,_false> *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  size_t in_stack_fffffffffffffde0;
  anon_class_1_0_00000001 local_200 [64];
  string local_1c0 [32];
  string local_1a0 [8];
  filename_t *in_stack_fffffffffffffe68;
  undefined8 local_180 [3];
  undefined1 local_168 [16];
  undefined8 local_158 [4];
  undefined8 local_138;
  undefined1 *local_130;
  string *local_118;
  undefined8 *local_110;
  string *local_108;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  format_string_checker<char,_3,_0,_false> local_d0;
  char *local_78;
  size_t sStack_70;
  int local_60 [2];
  basic_string_view<char> local_58;
  undefined1 *local_40;
  basic_string_view<char> *local_38;
  undefined8 local_30;
  undefined8 *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  undefined8 local_10;
  undefined8 *local_8;
  
  if (in_RDX == 0) {
    std::__cxx11::string::string(in_RDI,in_RSI);
  }
  else {
    std::__cxx11::string::string(local_1a0);
    std::__cxx11::string::string(local_1c0);
    details::file_helper::split_by_extension(in_stack_fffffffffffffe68);
    __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffde0;
    std::tie<std::__cxx11::string,std::__cxx11::string>(__args,in_stack_fffffffffffffda0);
    this = local_200;
    std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x2962a9);
    calc_filename::anon_class_1_0_00000001::operator()(this);
    pbVar4 = (basic_string_view<char> *)&stack0xfffffffffffffdd0;
    local_40 = &local_231;
    local_38 = pbVar4;
    bVar3 = ::fmt::v11::operator()((FMT_COMPILE_STRING *)0x2962e9);
    *pbVar4 = bVar3;
    local_58 = ::fmt::v11::operator()((FMT_COMPILE_STRING *)0x296305);
    pcVar1 = local_58.data_;
    sVar2 = local_58.size_;
    local_78 = local_58.data_;
    sStack_70 = local_58.size_;
    local_e8 = local_58.data_._0_4_;
    uStack_e4 = local_58.data_._4_4_;
    uStack_e0 = (undefined4)local_58.size_;
    uStack_dc = local_58.size_._4_4_;
    ::fmt::v11::detail::format_string_checker<char,3,0,false>::
    format_string_checker<std::__cxx11::string&,unsigned_long&,std::__cxx11::string&>
              (&local_d0,pcVar1,sVar2);
    bVar3.size_ = in_stack_fffffffffffffde0;
    bVar3.data_ = in_stack_fffffffffffffdd8;
    ::fmt::v11::detail::
    parse_format_string<char,fmt::v11::detail::format_string_checker<char,3,0,false>>
              (bVar3,in_stack_fffffffffffffdd0);
    local_60[0] = 0;
    ::fmt::v11::detail::ignore_unused<int>(local_60);
    local_108 = local_1a0;
    local_110 = local_180;
    local_118 = local_1c0;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
              ((value<fmt::v11::context> *)this,__args);
    local_28 = local_158;
    local_30 = *local_110;
    local_10 = local_30;
    local_8 = local_28;
    local_158[0] = local_30;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
              ((value<fmt::v11::context> *)this,__args);
    local_18 = &local_138;
    local_20 = local_168;
    local_138 = 0xd4d;
    local_130 = local_20;
    ::fmt::v11::vformat_abi_cxx11_(in_stack_00000010,in_stack_00000000);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::string::~string(local_1a0);
  }
  return in_RDI;
}

Assistant:

SPDLOG_INLINE filename_t rotating_file_sink<Mutex>::calc_filename(const filename_t &filename,
                                                                  std::size_t index) {
    if (index == 0u) {
        return filename;
    }

    filename_t basename, ext;
    std::tie(basename, ext) = details::file_helper::split_by_extension(filename);
    return fmt_lib::format(SPDLOG_FMT_STRING(SPDLOG_FILENAME_T("{}.{}{}")), basename, index, ext);
}